

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

bool __thiscall Amiga::Chipset::DiskDMA::advance_dma(DiskDMA *this)

{
  uint16_t *puVar1;
  uint uVar2;
  size_t sVar3;
  bool bVar4;
  
  if ((((this->dma_enable_ == true) && (this->write_ == false)) && (this->length_ != 0)) &&
     (sVar3 = this->buffer_read_, sVar3 != this->buffer_write_)) {
    uVar2 = *(uint *)&(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14;
    (this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_
    [(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_mask_ & uVar2] =
         (this->buffer_)._M_elems[(uint)sVar3 & 3];
    *(uint *)&(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14 = uVar2 + 1;
    this->buffer_read_ = sVar3 + 1;
    puVar1 = &this->length_;
    *puVar1 = *puVar1 - 1;
    bVar4 = true;
    if (*puVar1 == 0) {
      posit_interrupt((this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.chipset_,2);
      this->state_ = Inactive;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Chipset::DiskDMA::advance_dma() {
	if(!dma_enable_) return false;

	if(!write_) {
		if(length_ && buffer_read_ != buffer_write_) {
			ram_[pointer_[0] & ram_mask_] = buffer_[buffer_read_ & 3];
			++pointer_[0];
			++buffer_read_;
			--length_;

			if(!length_) {
				chipset_.posit_interrupt(InterruptFlag::DiskBlock);
				state_ = State::Inactive;
			}

			return true;
		}
	}

	return false;
}